

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dwarf.c
# Opt level: O0

char * read_referenced_name_from_attr
                 (dwarf_data *ddata,unit *u,attr *attr,attr_val *val,
                 backtrace_error_callback error_callback,void *data)

{
  unit *puVar1;
  uint64_t offset_1;
  unit *alt_unit;
  uint64_t offset;
  unit *unit;
  void *data_local;
  backtrace_error_callback error_callback_local;
  attr_val *val_local;
  attr *attr_local;
  unit *u_local;
  dwarf_data *ddata_local;
  
  if ((attr->name == DW_AT_abstract_origin) || (attr->name == DW_AT_specification)) {
    if (attr->form == DW_FORM_ref_sig8) {
      ddata_local = (dwarf_data *)0x0;
    }
    else if (val->encoding == ATTR_VAL_REF_INFO) {
      puVar1 = find_unit(ddata->units,ddata->units_count,(val->u).uint);
      if (puVar1 == (unit *)0x0) {
        ddata_local = (dwarf_data *)0x0;
      }
      else {
        ddata_local = (dwarf_data *)
                      read_referenced_name
                                (ddata,puVar1,(long)(val->u).string - puVar1->low_offset,
                                 error_callback,data);
      }
    }
    else if ((val->encoding == ATTR_VAL_UINT) || (val->encoding == ATTR_VAL_REF_UNIT)) {
      ddata_local = (dwarf_data *)read_referenced_name(ddata,u,(val->u).uint,error_callback,data);
    }
    else if (val->encoding == ATTR_VAL_REF_ALT_INFO) {
      puVar1 = find_unit(ddata->altlink->units,ddata->altlink->units_count,(val->u).uint);
      if (puVar1 == (unit *)0x0) {
        ddata_local = (dwarf_data *)0x0;
      }
      else {
        ddata_local = (dwarf_data *)
                      read_referenced_name
                                (ddata->altlink,puVar1,(long)(val->u).string - puVar1->low_offset,
                                 error_callback,data);
      }
    }
    else {
      ddata_local = (dwarf_data *)0x0;
    }
  }
  else {
    ddata_local = (dwarf_data *)0x0;
  }
  return (char *)ddata_local;
}

Assistant:

static const char *
read_referenced_name_from_attr (struct dwarf_data *ddata, struct unit *u,
				struct attr *attr, struct attr_val *val,
				backtrace_error_callback error_callback,
				void *data)
{
  switch (attr->name)
    {
    case DW_AT_abstract_origin:
    case DW_AT_specification:
      break;
    default:
      return NULL;
    }

  if (attr->form == DW_FORM_ref_sig8)
    return NULL;

  if (val->encoding == ATTR_VAL_REF_INFO)
    {
      struct unit *unit
	= find_unit (ddata->units, ddata->units_count,
		     val->u.uint);
      if (unit == NULL)
	return NULL;

      uint64_t offset = val->u.uint - unit->low_offset;
      return read_referenced_name (ddata, unit, offset, error_callback, data);
    }

  if (val->encoding == ATTR_VAL_UINT
      || val->encoding == ATTR_VAL_REF_UNIT)
    return read_referenced_name (ddata, u, val->u.uint, error_callback, data);

  if (val->encoding == ATTR_VAL_REF_ALT_INFO)
    {
      struct unit *alt_unit
	= find_unit (ddata->altlink->units, ddata->altlink->units_count,
		     val->u.uint);
      if (alt_unit == NULL)
	return NULL;

      uint64_t offset = val->u.uint - alt_unit->low_offset;
      return read_referenced_name (ddata->altlink, alt_unit, offset,
				   error_callback, data);
    }

  return NULL;
}